

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

string * __thiscall google::StrError_abi_cxx11_(string *__return_storage_ptr__,google *this,int err)

{
  allocator<char> local_7d;
  int local_7c;
  char local_78 [4];
  int rc;
  char buf [100];
  int err_local;
  
  buf._92_4_ = SUB84(this,0);
  unique0x1000009e = __return_storage_ptr__;
  local_7c = posix_strerror_r(buf._92_4_,local_78,100);
  if ((local_7c < 0) || (local_78[0] == '\0')) {
    snprintf(local_78,100,"Error number %d",(ulong)(uint)buf._92_4_);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_78,&local_7d);
  std::allocator<char>::~allocator(&local_7d);
  return __return_storage_ptr__;
}

Assistant:

GLOG_NO_EXPORT
string StrError(int err) {
  char buf[100];
  int rc = posix_strerror_r(err, buf, sizeof(buf));
  if ((rc < 0) || (buf[0] == '\000')) {
    std::snprintf(buf, sizeof(buf), "Error number %d", err);
  }
  return buf;
}